

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Postprocess.cpp
# Opt level: O1

void __thiscall
Assimp::AMFImporter::PostprocessHelper_SplitFacesByTextureID
          (AMFImporter *this,
          list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
          *pInputList,
          list<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>,_std::allocator<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>_>_>
          *pOutputList_Separated)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  iterator __position;
  int iVar5;
  _Node *p_Var6;
  _Node *p_Var7;
  iterator it_old;
  bool bVar8;
  list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
  face_list_cur;
  SComplexFace face_start;
  _List_base<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
  local_68;
  aiFace local_50;
  _List_node_base *local_40;
  _List_node_base *p_Stack_38;
  
  std::__cxx11::
  _List_base<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>,_std::allocator<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>_>_>
  ::_M_clear(&pOutputList_Separated->
              super__List_base<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>,_std::allocator<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>_>_>
            );
  (pOutputList_Separated->
  super__List_base<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>,_std::allocator<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>_>_>
  )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)pOutputList_Separated;
  (pOutputList_Separated->
  super__List_base<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>,_std::allocator<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>_>_>
  )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)pOutputList_Separated;
  (pOutputList_Separated->
  super__List_base<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>,_std::allocator<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>_>_>
  )._M_impl._M_node._M_size = 0;
  p_Var2 = (pInputList->
           super__List_base<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  do {
    if (p_Var2 == (_List_node_base *)pInputList) {
      return;
    }
    p_Var2 = (pInputList->
             super__List_base<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
             )._M_impl._M_node.super__List_node_base._M_next;
    local_50.mNumIndices = 0;
    local_50.mIndices = (uint *)0x0;
    aiFace::operator=(&local_50,(aiFace *)(p_Var2 + 1));
    local_40 = p_Var2[2]._M_next;
    local_68._M_impl._M_node._M_size = 0;
    __position._M_node =
         (pInputList->
         super__List_base<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
         )._M_impl._M_node.super__List_node_base._M_next;
    p_Var2 = p_Var2[2]._M_prev;
    local_68._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_68;
    local_68._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_68;
    while (p_Stack_38 = p_Var2, __position._M_node != (_List_node_base *)pInputList) {
      p_Var3 = __position._M_node[2]._M_prev;
      bVar8 = p_Var2 == (_List_node_base *)0x0 && p_Var3 == (_List_node_base *)0x0;
      if ((p_Var2 == (_List_node_base *)0x0) || (p_Var3 == (_List_node_base *)0x0)) {
LAB_003869a2:
        if (!bVar8) goto LAB_003869d3;
LAB_003869a6:
        p_Var2 = (__position._M_node)->_M_next;
        p_Var6 = std::__cxx11::
                 list<Assimp::AMFImporter::SComplexFace,std::allocator<Assimp::AMFImporter::SComplexFace>>
                 ::_M_create_node<Assimp::AMFImporter::SComplexFace_const&>
                           ((list<Assimp::AMFImporter::SComplexFace,std::allocator<Assimp::AMFImporter::SComplexFace>>
                             *)&local_68,(SComplexFace *)(__position._M_node + 1));
        std::__detail::_List_node_base::_M_hook(&p_Var6->super__List_node_base);
        local_68._M_impl._M_node._M_size = local_68._M_impl._M_node._M_size + 1;
        std::__cxx11::
        list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
        ::_M_erase(pInputList,__position);
        __position._M_node = p_Var2;
        p_Var2 = p_Stack_38;
      }
      else {
        p_Var4 = p_Var2[8]._M_next;
        if (((p_Var4 == p_Var3[8]._M_next) &&
            ((((p_Var4 == (_List_node_base *)0x0 ||
               (iVar5 = bcmp(p_Var2[7]._M_prev,p_Var3[7]._M_prev,(size_t)p_Var4), iVar5 == 0)) &&
              (p_Var4 = p_Var2[10]._M_next, p_Var4 == p_Var3[10]._M_next)) &&
             ((p_Var4 == (_List_node_base *)0x0 ||
              (iVar5 = bcmp(p_Var2[9]._M_prev,p_Var3[9]._M_prev,(size_t)p_Var4), iVar5 == 0)))))) &&
           ((p_Var4 = p_Var2[0xc]._M_next, p_Var4 == p_Var3[0xc]._M_next &&
            (((p_Var4 == (_List_node_base *)0x0 ||
              (iVar5 = bcmp(p_Var2[0xb]._M_prev,p_Var3[0xb]._M_prev,(size_t)p_Var4), iVar5 == 0)) &&
             (p_Var4 = p_Var2[0xe]._M_next, p_Var4 == p_Var3[0xe]._M_next)))))) {
          if (p_Var4 != (_List_node_base *)0x0) {
            iVar5 = bcmp(p_Var2[0xd]._M_prev,p_Var3[0xd]._M_prev,(size_t)p_Var4);
            bVar8 = iVar5 == 0;
            goto LAB_003869a2;
          }
          goto LAB_003869a6;
        }
LAB_003869d3:
        __position._M_node = (__position._M_node)->_M_next;
        p_Var2 = p_Stack_38;
      }
    }
    if (local_68._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_68) {
      p_Var7 = std::__cxx11::
               list<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,std::allocator<Assimp::AMFImporter::SComplexFace>>,std::allocator<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,std::allocator<Assimp::AMFImporter::SComplexFace>>>>
               ::
               _M_create_node<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,std::allocator<Assimp::AMFImporter::SComplexFace>>const&>
                         ((list<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,std::allocator<Assimp::AMFImporter::SComplexFace>>,std::allocator<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,std::allocator<Assimp::AMFImporter::SComplexFace>>>>
                           *)pOutputList_Separated,
                          (list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
                           *)&local_68);
      std::__detail::_List_node_base::_M_hook(&p_Var7->super__List_node_base);
      psVar1 = &(pOutputList_Separated->
                super__List_base<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>,_std::allocator<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>_>_>
                )._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
    }
    std::__cxx11::
    _List_base<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
    ::_M_clear(&local_68);
    if (local_50.mIndices != (uint *)0x0) {
      operator_delete__(local_50.mIndices);
    }
    p_Var2 = (pInputList->
             super__List_base<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
             )._M_impl._M_node.super__List_node_base._M_next;
  } while( true );
}

Assistant:

void AMFImporter::PostprocessHelper_SplitFacesByTextureID(std::list<SComplexFace>& pInputList, std::list<std::list<SComplexFace> >& pOutputList_Separated)
{
    auto texmap_is_equal = [](const CAMFImporter_NodeElement_TexMap* pTexMap1, const CAMFImporter_NodeElement_TexMap* pTexMap2) -> bool
    {
	    if((pTexMap1 == nullptr) && (pTexMap2 == nullptr)) return true;
	    if(pTexMap1 == nullptr) return false;
	    if(pTexMap2 == nullptr) return false;

	    if(pTexMap1->TextureID_R != pTexMap2->TextureID_R) return false;
	    if(pTexMap1->TextureID_G != pTexMap2->TextureID_G) return false;
	    if(pTexMap1->TextureID_B != pTexMap2->TextureID_B) return false;
	    if(pTexMap1->TextureID_A != pTexMap2->TextureID_A) return false;

	    return true;
    };

	pOutputList_Separated.clear();
	if(pInputList.empty()) return;

	do
	{
		SComplexFace face_start = pInputList.front();
		std::list<SComplexFace> face_list_cur;

		for(std::list<SComplexFace>::iterator it = pInputList.begin(), it_end = pInputList.end(); it != it_end;)
		{
			if(texmap_is_equal(face_start.TexMap, it->TexMap))
			{
				auto it_old = it;

				++it;
				face_list_cur.push_back(*it_old);
				pInputList.erase(it_old);
			}
			else
			{
				++it;
			}
		}

		if(!face_list_cur.empty()) pOutputList_Separated.push_back(face_list_cur);

	} while(!pInputList.empty());
}